

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physfs_lzmasdk.h
# Opt level: O0

SRes LzmaDec_AllocateProbs(CLzmaDec *p,Byte *props,uint propsSize,ISzAlloc *alloc)

{
  int __result___1;
  int __result__;
  CLzmaProps propNew;
  ISzAlloc *alloc_local;
  uint propsSize_local;
  Byte *props_local;
  CLzmaDec *p_local;
  
  propNew._8_8_ = alloc;
  p_local._4_4_ = LzmaProps_Decode((CLzmaProps *)&__result___1,props,propsSize);
  if ((p_local._4_4_ == 0) &&
     (p_local._4_4_ =
           LzmaDec_AllocateProbs2(p,(CLzmaProps *)&__result___1,(ISzAlloc *)propNew._8_8_),
     p_local._4_4_ == 0)) {
    (p->prop).lc = __result___1;
    (p->prop).lp = __result__;
    (p->prop).pb = propNew.lc;
    (p->prop).dicSize = propNew.lp;
    p_local._4_4_ = 0;
  }
  return p_local._4_4_;
}

Assistant:

static SRes LzmaDec_AllocateProbs(CLzmaDec *p, const Byte *props, unsigned propsSize, ISzAlloc *alloc)
{
  CLzmaProps propNew;
  RINOK(LzmaProps_Decode(&propNew, props, propsSize));
  RINOK(LzmaDec_AllocateProbs2(p, &propNew, alloc));
  p->prop = propNew;
  return SZ_OK;
}